

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::FboRenderCase::iterate(FboRenderCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  RenderContext *context_00;
  RenderTarget *this_00;
  TestLog *log_00;
  char *str;
  float *pfVar11;
  PixelFormat *pPVar12;
  MessageBuilder *pMVar13;
  Enum<int,_2UL> EVar14;
  char *local_6830;
  bool local_681a;
  bool isOk;
  bool imagesOk;
  float threshold;
  Enum<int,_2UL> local_6708;
  GetNameFunc local_66f8;
  int local_66f0;
  Enum<int,_2UL> local_66e8;
  MessageBuilder local_66d8;
  byte local_6551;
  undefined1 local_6550 [7];
  bool errorCodesOk;
  MultisamplePixelBufferAccess local_6528;
  MultisamplePixelBufferAccess local_6500;
  ReferenceContextLimits local_64d8;
  undefined1 local_6480 [8];
  ReferenceContext context_1;
  undefined1 local_2c0 [8];
  ReferenceContextBuffers buffers;
  FboIncompleteException *e;
  undefined1 local_228 [8];
  GLContext context;
  GLenum refError;
  GLenum gles2Error;
  undefined1 local_a0 [8];
  Surface refFrame;
  Surface gles2Frame;
  int y;
  int x;
  int yMax;
  int xMax;
  int height;
  int width;
  deRandom rnd;
  char *failReason;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  Vec4 clearColor;
  FboRenderCase *this_local;
  
  clearColor.m_data._8_8_ = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderCtx,0.125,0.25,0.5,1.0);
  context_00 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  this_00 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  rnd.z = 0;
  rnd.w = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(str);
  deRandom_init((deRandom *)&height,dVar5);
  iVar6 = tcu::RenderTarget::getWidth(this_00);
  iVar6 = ::deMin32(iVar6,0x80);
  iVar7 = tcu::RenderTarget::getHeight(this_00);
  iVar7 = ::deMin32(iVar7,0x80);
  iVar8 = tcu::RenderTarget::getWidth(this_00);
  iVar9 = tcu::RenderTarget::getHeight(this_00);
  dVar5 = deRandom_getUint32((deRandom *)&height);
  dVar10 = deRandom_getUint32((deRandom *)&height);
  tcu::Surface::Surface((Surface *)&refFrame.m_pixels.m_cap,iVar6,iVar7);
  tcu::Surface::Surface((Surface *)local_a0,iVar6,iVar7);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)&e,dVar5 % ((iVar8 - iVar6) + 1U),dVar10 % ((iVar9 - iVar7) + 1U),
             iVar6,iVar7);
  sglr::GLContext::GLContext((GLContext *)local_228,context_00,log_00,1,(IVec4 *)&e);
  pfVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&renderCtx);
  fVar1 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&renderCtx);
  fVar2 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&renderCtx);
  fVar3 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&renderCtx);
  sglr::GLContext::clearColor((GLContext *)local_228,fVar1,fVar2,fVar3,*pfVar11);
  sglr::GLContext::clear((GLContext *)local_228,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,local_228,&refFrame.m_pixels.m_cap);
  dVar5 = sglr::GLContext::getError((GLContext *)local_228);
  sglr::GLContext::~GLContext((GLContext *)local_228);
  pPVar12 = tcu::RenderTarget::getPixelFormat(this_00);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar12->alphaBits != 0) << 3);
  iVar8 = tcu::RenderTarget::getDepthBits(this_00);
  iVar9 = tcu::RenderTarget::getStencilBits(this_00);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_2c0,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar8,iVar9,iVar6,iVar7,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_64d8,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6500,(ReferenceContextBuffers *)local_2c0);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6528,(ReferenceContextBuffers *)local_2c0);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6550,(ReferenceContextBuffers *)local_2c0);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6480,&local_64d8,&local_6500,&local_6528,
             (MultisamplePixelBufferAccess *)local_6550);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_64d8);
  pfVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&renderCtx);
  fVar1 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&renderCtx);
  fVar2 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&renderCtx);
  fVar3 = *pfVar11;
  pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&renderCtx);
  sglr::ReferenceContext::clearColor((ReferenceContext *)local_6480,fVar1,fVar2,fVar3,*pfVar11);
  sglr::ReferenceContext::clear((ReferenceContext *)local_6480,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,local_6480,local_a0);
  context.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       sglr::ReferenceContext::getError((ReferenceContext *)local_6480);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6480);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_2c0);
  local_6551 = dVar5 == context.m_programs.
                        super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if (!(bool)local_6551) {
    tcu::TestLog::operator<<(&local_66d8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_66d8,(char (*) [26])"Error code mismatch: got ");
    EVar14 = glu::getErrorStr(dVar5);
    local_66f8 = EVar14.m_getName;
    local_66f0 = EVar14.m_value;
    local_66e8.m_getName = local_66f8;
    local_66e8.m_value = local_66f0;
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_66e8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [12])0x2c16365);
    EVar14 = glu::getErrorStr(context.m_programs.
                              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_6708.m_getName = EVar14.m_getName;
    local_6708.m_value = EVar14.m_value;
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_6708);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_66d8);
    rnd._8_8_ = anon_var_dwarf_dfdf8e;
  }
  bVar4 = tcu::fuzzyCompare(log_00,"ComparisonResult","Image comparison result",(Surface *)local_a0,
                            (Surface *)&refFrame.m_pixels.m_cap,0.03,COMPARE_LOG_RESULT);
  if ((!bVar4) && (rnd._8_8_ == 0)) {
    rnd._8_8_ = anon_var_dwarf_971ee2;
  }
  local_681a = false;
  if ((local_6551 & 1) != 0) {
    local_681a = bVar4;
  }
  if (local_681a == false) {
    local_6830 = (char *)rnd._8_8_;
  }
  else {
    local_6830 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(local_681a == false),local_6830);
  buffers.m_stencilbuffer.m_data.m_cap._4_4_ = 1;
  tcu::Surface::~Surface((Surface *)local_a0);
  tcu::Surface::~Surface((Surface *)&refFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

TestCase::IterateResult FboRenderCase::iterate (void)
{
	Vec4						clearColor				(0.125f, 0.25f, 0.5f, 1.0f);
	glu::RenderContext&			renderCtx				= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();
	const char*					failReason				= DE_NULL;

	// Position & size for context
	deRandom rnd;
	deRandom_init(&rnd, deStringHash(getName()));

	int		width	= deMin32(renderTarget.getWidth(), 128);
	int		height	= deMin32(renderTarget.getHeight(), 128);
	int		xMax	= renderTarget.getWidth()-width+1;
	int		yMax	= renderTarget.getHeight()-height+1;
	int		x		= deRandom_getUint32(&rnd) % xMax;
	int		y		= deRandom_getUint32(&rnd) % yMax;

	tcu::Surface	gles2Frame	(width, height);
	tcu::Surface	refFrame	(width, height);
	GLenum			gles2Error;
	GLenum			refError;

	// Render using GLES2
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, gles2Frame); // Call actual render func
		gles2Error = context.getError();
	}
	catch (const FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			// Mark test case as unsupported
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw; // Propagate error
	}

	// Render reference image
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, refFrame);
		refError = context.getError();
	}

	// Compare error codes
	bool errorCodesOk = (gles2Error == refError);

	if (!errorCodesOk)
	{
		log << tcu::TestLog::Message << "Error code mismatch: got " << glu::getErrorStr(gles2Error) << ", expected " << glu::getErrorStr(refError) << tcu::TestLog::EndMessage;
		failReason = "Got unexpected error";
	}

	// Compare images
	const float		threshold	= 0.03f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodesOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}